

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodExceptionTextTest.cpp
# Opt level: O2

void __thiscall MethodExceptionTextTest::MethodExceptionTextTest(MethodExceptionTextTest *this)

{
  allocator<char> local_79;
  char local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  char local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  shared_ptr<oout::EqualMatch> local_58;
  shared_ptr<const_oout::NamedTest> local_48;
  shared_ptr<WithExceptionInMethod> local_38;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"Exception in method represent as a text",&local_79);
  local_38.super___shared_ptr<WithExceptionInMethod,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)WithExceptionInMethod::failure;
  local_38.super___shared_ptr<WithExceptionInMethod,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<WithExceptionInMethod>();
  std::
  make_shared<oout::MethodExceptionText,void(WithExceptionInMethod::*)(std::__cxx11::string_const&)const,std::shared_ptr<WithExceptionInMethod>,char_const(&)[8]>
            ((offset_in_WithExceptionInMethod_to_subr *)&local_58,&local_38,&local_68);
  std::make_shared<oout::EqualMatch,char_const(&)[8]>(&local_78);
  std::
  make_shared<oout::NamedTest_const,char_const(&)[46],std::shared_ptr<oout::MethodExceptionText>,std::shared_ptr<oout::EqualMatch>>
            ((char (*) [46])&local_48,
             (shared_ptr<oout::MethodExceptionText> *)
             "MethodExceptionText catch exception as a text",&local_58);
  oout::dirty::Test::Test<std::shared_ptr<oout::NamedTest_const>>
            (&this->super_Test,&local_28,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  std::__cxx11::string::~string((string *)&local_28);
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__Test_001cc278;
  return;
}

Assistant:

MethodExceptionTextTest::MethodExceptionTextTest()
: dirty::Test(
	"Exception in method represent as a text",
	make_shared<const NamedTest>(
		"MethodExceptionText catch exception as a text",
		make_shared<MethodExceptionText>(
			&WithExceptionInMethod::failure,
			make_shared<WithExceptionInMethod>(),
			"no fate"
		),
		make_shared<EqualMatch>("no fate")
	)
)
{
}